

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O0

uint * Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *pObj,Vec_Int_t *vTruth,int nWords)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  uint *puVar3;
  uint *puVar4;
  int local_44;
  int i;
  uint *pTruth1;
  uint *pTruth0;
  uint *pTruth;
  int nWords_local;
  Vec_Int_t *vTruth_local;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopTruth.c"
                  ,0x65,"unsigned int *Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 == 0) || (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pObj_local = (Hop_Obj_t *)(pObj->field_0).pData;
  }
  else {
    pHVar2 = Hop_ObjFanin0(pObj);
    puVar3 = Hop_ManConvertAigToTruth_rec2(pHVar2,vTruth,nWords);
    pHVar2 = Hop_ObjFanin1(pObj);
    puVar4 = Hop_ManConvertAigToTruth_rec2(pHVar2,vTruth,nWords);
    pObj_local = (Hop_Obj_t *)Vec_IntFetch(vTruth,nWords);
    iVar1 = Hop_ObjIsExor(pObj);
    if (iVar1 == 0) {
      iVar1 = Hop_ObjFaninC0(pObj);
      if ((iVar1 == 0) && (iVar1 = Hop_ObjFaninC1(pObj), iVar1 == 0)) {
        for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
          *(uint *)((long)&pObj_local->field_0 + (long)local_44 * 4) =
               puVar3[local_44] & puVar4[local_44];
        }
      }
      else {
        iVar1 = Hop_ObjFaninC0(pObj);
        if ((iVar1 == 0) && (iVar1 = Hop_ObjFaninC1(pObj), iVar1 != 0)) {
          for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
            *(uint *)((long)&pObj_local->field_0 + (long)local_44 * 4) =
                 puVar3[local_44] & (puVar4[local_44] ^ 0xffffffff);
          }
        }
        else {
          iVar1 = Hop_ObjFaninC0(pObj);
          if ((iVar1 == 0) || (iVar1 = Hop_ObjFaninC1(pObj), iVar1 != 0)) {
            for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
              *(uint *)((long)&pObj_local->field_0 + (long)local_44 * 4) =
                   (puVar3[local_44] ^ 0xffffffff) & (puVar4[local_44] ^ 0xffffffff);
            }
          }
          else {
            for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
              *(uint *)((long)&pObj_local->field_0 + (long)local_44 * 4) =
                   (puVar3[local_44] ^ 0xffffffff) & puVar4[local_44];
            }
          }
        }
      }
    }
    else {
      for (local_44 = 0; local_44 < nWords; local_44 = local_44 + 1) {
        *(uint *)((long)&pObj_local->field_0 + (long)local_44 * 4) =
             puVar3[local_44] ^ puVar4[local_44];
      }
    }
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 == 0) {
      __assert_fail("Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopTruth.c"
                    ,0x7c,
                    "unsigned int *Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *, Vec_Int_t *, int)");
    }
    Hop_ObjClearMarkA(pObj);
    (pObj->field_0).pData = pObj_local;
  }
  return (uint *)pObj_local;
}

Assistant:

unsigned * Hop_ManConvertAigToTruth_rec2( Hop_Obj_t * pObj, Vec_Int_t * vTruth, int nWords )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    int i;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return (unsigned *)pObj->pData;
    // compute the truth tables of the fanins
    pTruth0 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin0(pObj), vTruth, nWords );
    pTruth1 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin1(pObj), vTruth, nWords );
    // creat the truth table of the node
    pTruth  = Vec_IntFetch( vTruth, nWords );
    if ( Hop_ObjIsExor(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
    pObj->pData = pTruth;
    return pTruth;
}